

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcWindowSizeAfterConstraint(ImGuiWindow *window,ImVec2 *size_desired)

{
  float fVar1;
  ImGuiSizeCallback p_Var2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *g;
  ImGuiWindow *window_for_height;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ImGuiSizeCallbackData data;
  ImGuiSizeCallbackData local_40;
  
  pIVar4 = GImGui;
  auVar7._8_8_ = 0;
  auVar7._0_4_ = size_desired->x;
  auVar7._4_4_ = size_desired->y;
  if (((GImGui->NextWindowData).Flags & 0x10) == 0) goto LAB_0015c450;
  fVar5 = (GImGui->NextWindowData).SizeConstraintRect.Min.x;
  fVar6 = (GImGui->NextWindowData).SizeConstraintRect.Min.y;
  if ((fVar5 < 0.0) || (fVar1 = (GImGui->NextWindowData).SizeConstraintRect.Max.x, fVar1 < 0.0)) {
    auVar8 = ZEXT416((uint)(window->SizeFull).x);
  }
  else {
    auVar9 = vminss_avx(ZEXT416((uint)fVar1),auVar7);
    auVar8 = vcmpss_avx(auVar7,ZEXT416((uint)fVar5),1);
    auVar8 = vblendvps_avx(auVar9,ZEXT416((uint)fVar5),auVar8);
  }
  if (fVar6 < 0.0) {
LAB_0015c3ef:
    auVar7 = ZEXT416((uint)(window->SizeFull).y);
  }
  else {
    fVar5 = (GImGui->NextWindowData).SizeConstraintRect.Max.y;
    if (fVar5 < 0.0) goto LAB_0015c3ef;
    auVar7 = vmovshdup_avx(auVar7);
    auVar9 = vminss_avx(ZEXT416((uint)fVar5),auVar7);
    auVar7 = vcmpss_avx(auVar7,ZEXT416((uint)fVar6),1);
    auVar7 = vblendvps_avx(auVar9,ZEXT416((uint)fVar6),auVar7);
  }
  auVar8 = vinsertps_avx(auVar8,auVar7,0x10);
  p_Var2 = (GImGui->NextWindowData).SizeCallback;
  if (p_Var2 != (ImGuiSizeCallback)0x0) {
    local_40.UserData = (GImGui->NextWindowData).SizeCallbackUserData;
    local_40.CurrentSize = window->SizeFull;
    local_40.Pos = window->Pos;
    local_40.DesiredSize = (ImVec2)vmovlps_avx(auVar8);
    (*p_Var2)(&local_40);
    auVar8._8_8_ = 0;
    auVar8._0_4_ = local_40.DesiredSize.x;
    auVar8._4_4_ = local_40.DesiredSize.y;
  }
  auVar9._0_4_ = (int)auVar8._0_4_;
  auVar9._4_4_ = (int)auVar8._4_4_;
  auVar9._8_4_ = (int)auVar8._8_4_;
  auVar9._12_4_ = (int)auVar8._12_4_;
  auVar7 = vcvtdq2ps_avx(auVar9);
LAB_0015c450:
  IVar3 = auVar7._0_8_;
  if ((window->Flags & 0x1000040U) == 0) {
    auVar9 = ZEXT416((uint)(pIVar4->Style).WindowMinSize.x);
    auVar8 = vcmpss_avx(auVar9,auVar7,2);
    auVar8 = vblendvps_avx(auVar9,auVar7,auVar8);
    auVar9 = vmovshdup_avx(auVar7);
    auVar10 = ZEXT416((uint)(pIVar4->Style).WindowMinSize.y);
    auVar7 = vcmpss_avx(auVar10,auVar9,2);
    auVar7 = vblendvps_avx(auVar10,auVar9,auVar7);
    fVar5 = 0.0;
    if ((window->Flags & 1U) == 0) {
      fVar5 = GImGui->FontBaseSize * window->FontWindowScale;
      if (window->ParentWindow != (ImGuiWindow *)0x0) {
        fVar5 = fVar5 * window->ParentWindow->FontWindowScale;
      }
      fVar6 = (GImGui->Style).FramePadding.y;
      fVar5 = fVar6 + fVar6 + fVar5;
    }
    fVar6 = ImGuiWindow::MenuBarHeight(window);
    auVar10 = ZEXT416((uint)((pIVar4->Style).WindowRounding + -1.0));
    auVar9 = vcmpss_avx(auVar10,ZEXT416(0),2);
    auVar9 = vandnps_avx(auVar9,auVar10);
    auVar10 = ZEXT416((uint)(fVar6 + fVar5 + auVar9._0_4_));
    auVar9 = vcmpss_avx(auVar10,auVar7,2);
    auVar7 = vblendvps_avx(auVar10,auVar7,auVar9);
    auVar7 = vinsertps_avx(auVar8,auVar7,0x10);
    IVar3 = auVar7._0_8_;
  }
  return IVar3;
}

Assistant:

static ImVec2 CalcWindowSizeAfterConstraint(ImGuiWindow* window, const ImVec2& size_desired)
{
    ImGuiContext& g = *GImGui;
    ImVec2 new_size = size_desired;
    if (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint)
    {
        // Using -1,-1 on either X/Y axis to preserve the current size.
        ImRect cr = g.NextWindowData.SizeConstraintRect;
        new_size.x = (cr.Min.x >= 0 && cr.Max.x >= 0) ? ImClamp(new_size.x, cr.Min.x, cr.Max.x) : window->SizeFull.x;
        new_size.y = (cr.Min.y >= 0 && cr.Max.y >= 0) ? ImClamp(new_size.y, cr.Min.y, cr.Max.y) : window->SizeFull.y;
        if (g.NextWindowData.SizeCallback)
        {
            ImGuiSizeCallbackData data;
            data.UserData = g.NextWindowData.SizeCallbackUserData;
            data.Pos = window->Pos;
            data.CurrentSize = window->SizeFull;
            data.DesiredSize = new_size;
            g.NextWindowData.SizeCallback(&data);
            new_size = data.DesiredSize;
        }
        new_size.x = IM_FLOOR(new_size.x);
        new_size.y = IM_FLOOR(new_size.y);
    }

    // Minimum size
    if (!(window->Flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_AlwaysAutoResize)))
    {
        ImGuiWindow* window_for_height = window;
        new_size = ImMax(new_size, g.Style.WindowMinSize);
        new_size.y = ImMax(new_size.y, window_for_height->TitleBarHeight() + window_for_height->MenuBarHeight() + ImMax(0.0f, g.Style.WindowRounding - 1.0f)); // Reduce artifacts with very small windows
    }
    return new_size;
}